

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_store_fpr32(DisasContext_conflict6 *ctx,TCGv_i32 t,int reg)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 t64;
  TCGContext_conflict6 *tcg_ctx;
  int reg_local;
  TCGv_i32 t_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->hflags & 0x2000000) != 0) {
    generate_exception(ctx,0x14);
  }
  ret = tcg_temp_new_i64(tcg_ctx_00);
  tcg_gen_extu_i32_i64_mips64el(tcg_ctx_00,ret,t);
  tcg_gen_deposit_i64_mips64el
            (tcg_ctx_00,tcg_ctx_00->fpu_f64[reg],tcg_ctx_00->fpu_f64[reg],ret,0,0x20);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_store_fpr32(DisasContext *ctx, TCGv_i32 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t64;
    if (ctx->hflags & MIPS_HFLAG_FRE) {
        generate_exception(ctx, EXCP_RI);
    }
    t64 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_extu_i32_i64(tcg_ctx, t64, t);
    tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->fpu_f64[reg], tcg_ctx->fpu_f64[reg], t64, 0, 32);
    tcg_temp_free_i64(tcg_ctx, t64);
}